

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O0

void IoTHubTransport_MQTT_Common_Destroy(TRANSPORT_LL_HANDLE handle)

{
  int iVar1;
  PDLIST_ENTRY pDVar2;
  MQTT_DEVICE_TWIN_ITEM *mqtt_device_twin_1;
  PDLIST_ENTRY currentEntry_2;
  MQTT_DEVICE_TWIN_ITEM *mqtt_device_twin;
  PDLIST_ENTRY currentEntry_1;
  MQTT_MESSAGE_DETAILS_LIST *mqttMsgEntry;
  PDLIST_ENTRY currentEntry;
  PMQTTTRANSPORT_HANDLE_DATA transport_data;
  TRANSPORT_LL_HANDLE handle_local;
  
  if (handle != (TRANSPORT_LL_HANDLE)0x0) {
    *(undefined1 *)((long)handle + 0x8c) = 1;
    DisconnectFromClient((PMQTTTRANSPORT_HANDLE_DATA)handle);
    while (iVar1 = DList_IsListEmpty((PDLIST_ENTRY)((long)handle + 0xf8)), iVar1 == 0) {
      pDVar2 = DList_RemoveHeadList((PDLIST_ENTRY)((long)handle + 0xf8));
      notifyApplicationOfSendMessageComplete
                ((IOTHUB_MESSAGE_LIST *)pDVar2[-2].Blink,(PMQTTTRANSPORT_HANDLE_DATA)handle,
                 IOTHUB_CLIENT_CONFIRMATION_BECAUSE_DESTROY);
      free(&pDVar2[-3].Blink);
    }
    while (iVar1 = DList_IsListEmpty((PDLIST_ENTRY)((long)handle + 0xd0)), iVar1 == 0) {
      pDVar2 = DList_RemoveHeadList((PDLIST_ENTRY)((long)handle + 0xd0));
      if (pDVar2[1].Flink == (DLIST_ENTRY_TAG *)0x0) {
        (**(code **)((long)handle + 0x148))
                  (*(undefined4 *)((long)&pDVar2[-2].Blink + 4),0x198,
                   *(undefined8 *)((long)handle + 0x168));
      }
      else {
        (*(code *)pDVar2[1].Flink)(0,0,0,pDVar2[1].Blink);
      }
      destroyDeviceTwinGetMsg((MQTT_DEVICE_TWIN_ITEM *)(pDVar2 + -3));
    }
    while (iVar1 = DList_IsListEmpty((PDLIST_ENTRY)((long)handle + 0xe0)), iVar1 == 0) {
      pDVar2 = DList_RemoveHeadList((PDLIST_ENTRY)((long)handle + 0xe0));
      (*(code *)pDVar2[1].Flink)(0,0,0,pDVar2[1].Blink);
      destroyDeviceTwinGetMsg((MQTT_DEVICE_TWIN_ITEM *)(pDVar2 + -3));
    }
    freeTransportHandleData((MQTTTRANSPORT_HANDLE_DATA *)handle);
  }
  return;
}

Assistant:

void IoTHubTransport_MQTT_Common_Destroy(TRANSPORT_LL_HANDLE handle)
{
    PMQTTTRANSPORT_HANDLE_DATA transport_data = (PMQTTTRANSPORT_HANDLE_DATA)handle;
    if (transport_data != NULL)
    {
        transport_data->isDestroyCalled = true;

        DisconnectFromClient(transport_data);

        //Empty the Waiting for Ack Messages.
        while (!DList_IsListEmpty(&transport_data->telemetry_waitingForAck))
        {
            PDLIST_ENTRY currentEntry = DList_RemoveHeadList(&transport_data->telemetry_waitingForAck);
            MQTT_MESSAGE_DETAILS_LIST* mqttMsgEntry = containingRecord(currentEntry, MQTT_MESSAGE_DETAILS_LIST, entry);
            notifyApplicationOfSendMessageComplete(mqttMsgEntry->iotHubMessageEntry, transport_data, IOTHUB_CLIENT_CONFIRMATION_BECAUSE_DESTROY);
            free(mqttMsgEntry);
        }
        while (!DList_IsListEmpty(&transport_data->ack_waiting_queue))
        {
            PDLIST_ENTRY currentEntry = DList_RemoveHeadList(&transport_data->ack_waiting_queue);
            MQTT_DEVICE_TWIN_ITEM* mqtt_device_twin = containingRecord(currentEntry, MQTT_DEVICE_TWIN_ITEM, entry);

            if (mqtt_device_twin->userCallback == NULL)
            {
                transport_data->transport_callbacks.twin_rpt_state_complete_cb(mqtt_device_twin->iothub_msg_id, STATUS_CODE_TIMEOUT_VALUE, transport_data->transport_ctx);
            }
            else
            {
                mqtt_device_twin->userCallback(DEVICE_TWIN_UPDATE_COMPLETE, NULL, 0, mqtt_device_twin->userContext);
            }

            destroyDeviceTwinGetMsg(mqtt_device_twin);
        }
        while (!DList_IsListEmpty(&transport_data->pending_get_twin_queue))
        {
            PDLIST_ENTRY currentEntry = DList_RemoveHeadList(&transport_data->pending_get_twin_queue);

            MQTT_DEVICE_TWIN_ITEM* mqtt_device_twin = containingRecord(currentEntry, MQTT_DEVICE_TWIN_ITEM, entry);

            mqtt_device_twin->userCallback(DEVICE_TWIN_UPDATE_COMPLETE, NULL, 0, mqtt_device_twin->userContext);

            destroyDeviceTwinGetMsg(mqtt_device_twin);
        }

        freeTransportHandleData(transport_data);
    }
}